

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmCommonTargetGenerator::AppendFortranFormatFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *pcVar2;
  bool bVar3;
  FortranFormat FVar4;
  char *pcVar5;
  allocator<char> local_41;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Fortran_FORMAT","");
  pcVar5 = cmSourceFile::GetProperty(source,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  FVar4 = cmOutputConverter::GetFortranFormat(pcVar5);
  if (FVar4 == FortranFormatNone) {
    this_00 = this->GeneratorTarget;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Fortran_FORMAT","");
    pcVar5 = cmGeneratorTarget::GetProperty(this_00,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    FVar4 = cmOutputConverter::GetFortranFormat(pcVar5);
  }
  if (FVar4 == FortranFormatFree) {
    pcVar5 = "CMAKE_Fortran_FORMAT_FREE_FLAG";
  }
  else {
    if (FVar4 != FortranFormatFixed) {
      bVar3 = true;
      pcVar5 = (char *)0x0;
      goto LAB_00267a3f;
    }
    pcVar5 = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
  }
  bVar3 = false;
LAB_00267a3f:
  if (!bVar3) {
    this_01 = this->Makefile;
    pcVar2 = this->LocalCommonGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar5,&local_41);
    pcVar5 = cmMakefile::GetDefinition(this_01,&local_40);
    (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[7])(pcVar2,flags,pcVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranFormatFlags(
  std::string& flags, cmSourceFile const& source)
{
  const char* srcfmt = source.GetProperty("Fortran_FORMAT");
  cmOutputConverter::FortranFormat format =
    cmOutputConverter::GetFortranFormat(srcfmt);
  if (format == cmOutputConverter::FortranFormatNone) {
    const char* tgtfmt = this->GeneratorTarget->GetProperty("Fortran_FORMAT");
    format = cmOutputConverter::GetFortranFormat(tgtfmt);
  }
  const char* var = nullptr;
  switch (format) {
    case cmOutputConverter::FortranFormatFixed:
      var = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
      break;
    case cmOutputConverter::FortranFormatFree:
      var = "CMAKE_Fortran_FORMAT_FREE_FLAG";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendFlags(
      flags, this->Makefile->GetDefinition(var));
  }
}